

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  FuncState *fs_00;
  int *in_RSI;
  int e_2;
  int e_1;
  int e;
  int in_stack_ffffffffffffffc8;
  OpCode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  fs_00 = (FuncState *)(ulong)(*in_RSI - 6);
  switch(fs_00) {
  case (FuncState *)0x0:
    freeexp(fs_00,(expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    exp2reg((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            (expdesc *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (int)((ulong)fs_00 >> 0x20));
    return;
  case (FuncState *)0x1:
    luaK_exp2anyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (expdesc *)0x119d8c);
    luaK_codeABC(fs_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,0x119dae);
    break;
  case (FuncState *)0x2:
    luaK_exp2anyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (expdesc *)0x119dbf);
    luaK_codeABx(fs_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
    break;
  case (FuncState *)0x3:
    luaK_exp2RK((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                (expdesc *)fs_00);
    luaK_codeABC(fs_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,0x119e17);
  }
  freeexp(fs_00,(expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static void luaK_storevar(FuncState*fs,expdesc*var,expdesc*ex){
switch(var->k){
case VLOCAL:{
freeexp(fs,ex);
exp2reg(fs,ex,var->u.s.info);
return;
}
case VUPVAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABC(fs,OP_SETUPVAL,e,var->u.s.info,0);
break;
}
case VGLOBAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABx(fs,OP_SETGLOBAL,e,var->u.s.info);
break;
}
case VINDEXED:{
int e=luaK_exp2RK(fs,ex);
luaK_codeABC(fs,OP_SETTABLE,var->u.s.info,var->u.s.aux,e);
break;
}
default:{
break;
}
}
freeexp(fs,ex);
}